

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O1

RandNum __thiscall MetaSim::RandomGen::sample(RandomGen *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (this->_xn % 0x1f31d) * 0x41a7;
  lVar2 = (this->_xn / 0x1f31d) * -0xb14;
  lVar3 = lVar2 + lVar1;
  lVar1 = lVar2 + lVar1 + 0x7fffffff;
  if (-1 < lVar3) {
    lVar1 = lVar3;
  }
  this->_xn = lVar1;
  return lVar1;
}

Assistant:

RandNum RandomGen::sample()
    {
        RandNum xq, xr;

        xq = _xn / Q;
        xr = _xn % Q;

        _xn = A * xr - R * xq;
        if (_xn < 0) _xn += M;

        return _xn;
    }